

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,
                 unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                 *selector)

{
  _Base_ptr p_Var1;
  iterator descriptor;
  _Base_ptr local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_38 = (_Base_ptr)anon_unknown.dwarf_a336a3::TransformConfigure(action,selector,0);
  p_Var1 = (_Base_ptr)
           (selector->_M_t).
           super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
           .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
  (local_38[2]._M_left)->_M_parent = p_Var1;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:749:19)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:749:19)>
             ::_M_manager;
  local_30._M_unused._M_object = &local_38;
  (**(code **)(*(long *)&p_Var1->_M_color + 0x28))(p_Var1,this);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, 0);

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()));

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}